

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::AddSnappedEdges
          (S2Builder *this,InputEdgeId begin,InputEdgeId end,GraphOptions *options,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices)

{
  InputVertexId IVar1;
  SiteId SVar2;
  SiteId SVar3;
  DegenerateEdges DVar4;
  int32 id_00;
  EdgeType EVar5;
  const_reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  int local_68;
  int i;
  int local_54;
  InputEdgeIdSetId id;
  InputEdgeId e;
  vector<int,_std::allocator<int>_> chain;
  bool discard_degenerate_edges;
  vector<int,_std::allocator<int>_> *input_edge_ids_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  GraphOptions *options_local;
  InputEdgeId end_local;
  InputEdgeId begin_local;
  S2Builder *this_local;
  
  DVar4 = GraphOptions::degenerate_edges(options);
  chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = DVar4 == DISCARD;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&id);
  for (local_54 = begin; local_54 < end; local_54 = local_54 + 1) {
    id_00 = IdSetLexicon::AddSingleton(input_edge_id_set_lexicon,local_54);
    SnapEdge(this,local_54,(vector<int,_std::allocator<int>_> *)&id);
    pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (&this->input_edges_,(long)local_54);
    IVar1 = pvVar6->first;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&id,0);
    MaybeAddInputVertex(this,IVar1,*pvVar7,site_vertices);
    sVar8 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&id);
    if (sVar8 == 1) {
      if ((chain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._7_1_ & 1) == 0) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&id,0);
        SVar2 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&id,0);
        SVar3 = *pvVar7;
        EVar5 = GraphOptions::edge_type(options);
        AddSnappedEdge(this,SVar2,SVar3,id_00,EVar5,edges,input_edge_ids);
      }
    }
    else {
      pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&this->input_edges_,(long)local_54);
      IVar1 = pvVar6->second;
      pvVar7 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)&id);
      MaybeAddInputVertex(this,IVar1,*pvVar7,site_vertices);
      for (local_68 = 1;
          sVar8 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&id),
          (ulong)(long)local_68 < sVar8; local_68 = local_68 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&id,(long)(local_68 + -1));
        SVar2 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&id,(long)local_68);
        SVar3 = *pvVar7;
        EVar5 = GraphOptions::edge_type(options);
        AddSnappedEdge(this,SVar2,SVar3,id_00,EVar5,edges,input_edge_ids);
      }
    }
  }
  if ((s2builder_verbose & 1U) != 0) {
    DumpEdges(edges,&this->sites_);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&id);
  return;
}

Assistant:

void S2Builder::AddSnappedEdges(
    InputEdgeId begin, InputEdgeId end, const GraphOptions& options,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon,
    vector<compact_array<InputVertexId>>* site_vertices) const {
  bool discard_degenerate_edges = (options.degenerate_edges() ==
                                   GraphOptions::DegenerateEdges::DISCARD);
  vector<SiteId> chain;
  for (InputEdgeId e = begin; e < end; ++e) {
    InputEdgeIdSetId id = input_edge_id_set_lexicon->AddSingleton(e);
    SnapEdge(e, &chain);
    MaybeAddInputVertex(input_edges_[e].first, chain[0], site_vertices);
    if (chain.size() == 1) {
      if (discard_degenerate_edges) continue;
      AddSnappedEdge(chain[0], chain[0], id, options.edge_type(),
                     edges, input_edge_ids);
    } else {
      MaybeAddInputVertex(input_edges_[e].second, chain.back(), site_vertices);
      for (int i = 1; i < chain.size(); ++i) {
        AddSnappedEdge(chain[i-1], chain[i], id, options.edge_type(),
                       edges, input_edge_ids);
      }
    }
  }
  if (s2builder_verbose) DumpEdges(*edges, sites_);
}